

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_append_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x1140e0;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(local_20,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '\0';
  uStack_60 = 0x11411b;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,&c,1,1);
  if (bVar1 == true) {
    uStack_60 = 0x114135;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x4fc);
    if (local_30 == (char *)0x6) {
      uStack_60 = 0x114155;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x4fd);
      if (local_28 == (char *)0x8) {
        uStack_60 = 0x114175;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x4fe);
        if (local_20 == (char *)0x0) {
          ppcVar5 = &local_68;
          pcVar7 = "Assertion \'_ck_x != NULL\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %#x";
          pcVar9 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x4ff;
LAB_00114408:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(undefined8 *)((long)ppcVar5 + -8) = 0x11440f;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar7,pcVar4,pcVar9,pcVar8);
        }
        uStack_60 = 0x114192;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x4ff);
        if ((char *)(long)local_20[(long)(local_30 + -1)] != (char *)0x0) {
          ppcVar5 = &local_78;
          local_70 = "\'\\0\'";
          pcVar7 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar9 = "array.buffer[array.size - 1] == \'\\0\'";
          pcVar8 = "array.buffer[array.size - 1]";
          iVar2 = 0x500;
          local_78 = (char *)(long)local_20[(long)(local_30 + -1)];
          goto LAB_00114408;
        }
        uStack_60 = 0x1141bc;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x500);
        pcVar8 = local_20;
        if (local_20 == (char *)0x0) {
          pcVar4 = "";
          pcVar8 = "(null)";
        }
        else {
          uStack_60 = 0x1141d9;
          iVar2 = strcmp("01234",local_20);
          if (iVar2 == 0) {
            uStack_60 = 0x1141f2;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x501);
            if (local_38 == (code *)0x0) {
              ppcVar5 = &local_68;
              pcVar7 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar9 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x502;
              goto LAB_00114408;
            }
            uStack_60 = 0x11420f;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x502);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_60 = 0x114231;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x503);
              uStack_60 = 0x11423a;
              (*pcStack_40)(local_20);
              return;
            }
            local_70 = "1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x503;
            pcVar4 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_0011443e;
          }
          pcVar4 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "array.buffer == \"01234\"";
        pcVar9 = "array.buffer";
        iVar2 = 0x501;
        local_68 = "\"";
        local_70 = "01234";
        local_78 = "\"";
        pcStack_80 = "\"01234\"";
        ppcVar6 = &pcStack_90;
        pcStack_90 = pcVar8;
        pcStack_88 = pcVar4;
        goto LAB_00114446;
      }
      local_70 = "8";
      pcVar7 = "array.capacity == 8";
      pcVar9 = "array.capacity";
      iVar2 = 0x4fe;
      local_68 = (char *)0x8;
      pcVar4 = local_28;
    }
    else {
      local_70 = "6";
      pcVar7 = "array.size == 6";
      pcVar9 = "array.size";
      iVar2 = 0x4fd;
      local_68 = (char *)0x6;
      pcVar4 = local_30;
    }
  }
  else {
    pcVar4 = (char *)(ulong)bVar1;
    local_70 = "true";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == true";
    pcVar9 = "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
    ;
    iVar2 = 0x4fc;
LAB_0011443e:
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_70;
LAB_00114446:
  uStack_60 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(code **)((long)ppcVar6 + -0x10) = test_ADynArray_append_failure_bufferExpansionFailed_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar7,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[array.size - 1], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}